

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcPrint.c
# Opt level: O2

void Abc_NodePrintLevel(FILE *pFile,Abc_Obj_t *pNode)

{
  int iVar1;
  uint uVar2;
  Vec_Ptr_t *p;
  char *__ptr;
  Abc_Obj_t *pNode_00;
  size_t sStack_30;
  Abc_Obj_t *pDriver;
  
  uVar2 = *(uint *)&pNode->field_0x14;
  pNode_00 = pNode;
  if (0xfffffffd < (uVar2 & 0xf) - 5) {
    pNode_00 = (Abc_Obj_t *)pNode->pNtk->vObjs->pArray[*(pNode->vFanins).pArray];
    uVar2 = *(uint *)&pNode_00->field_0x14;
  }
  pDriver = pNode_00;
  if ((uVar2 & 0xf) == 8) {
    __ptr = "Latch.\n";
    sStack_30 = 7;
  }
  else {
    if ((uVar2 & 0xf) != 2) {
      iVar1 = Abc_NodeIsConst(pNode_00);
      if (iVar1 != 0) {
        fprintf((FILE *)pFile,"Constant %d.\n",(ulong)((*(uint *)&pNode->field_0x14 >> 10 & 1) == 0)
               );
        return;
      }
      fprintf((FILE *)pFile,"Level = %3d.  ",(ulong)(*(uint *)&pNode_00->field_0x14 >> 0xc));
      uVar2 = Abc_NodeMffcSize(pNode_00);
      fprintf((FILE *)pFile,"Mffc = %5d.  ",(ulong)uVar2);
      p = Abc_NtkDfsNodes(pNode->pNtk,&pDriver,1);
      fprintf((FILE *)pFile,"Cone = %5d.  ",(ulong)(uint)p->nSize);
      Vec_PtrFree(p);
      fputc(10,(FILE *)pFile);
      return;
    }
    __ptr = "Primary input.\n";
    sStack_30 = 0xf;
  }
  fwrite(__ptr,sStack_30,1,(FILE *)pFile);
  return;
}

Assistant:

void Abc_NodePrintLevel( FILE * pFile, Abc_Obj_t * pNode )
{
    Abc_Obj_t * pDriver;
    Vec_Ptr_t * vNodes;

    pDriver = Abc_ObjIsCo(pNode)? Abc_ObjFanin0(pNode) : pNode;
    if ( Abc_ObjIsPi(pDriver) )
    {
        fprintf( pFile, "Primary input.\n" );
        return;
    }
    if ( Abc_ObjIsLatch(pDriver) )
    {
        fprintf( pFile, "Latch.\n" );
        return;
    }
    if ( Abc_NodeIsConst(pDriver) )
    {
        fprintf( pFile, "Constant %d.\n", !Abc_ObjFaninC0(pNode) );
        return;
    }
    // print the level
    fprintf( pFile, "Level = %3d.  ", pDriver->Level );
    // print the size of MFFC
    fprintf( pFile, "Mffc = %5d.  ", Abc_NodeMffcSize(pDriver) );
    // print the size of the shole cone
    vNodes = Abc_NtkDfsNodes( pNode->pNtk, &pDriver, 1 );
    fprintf( pFile, "Cone = %5d.  ", Vec_PtrSize(vNodes) );
    Vec_PtrFree( vNodes );
    fprintf( pFile, "\n" );
}